

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

void IoTHubClientCore_LL_ConnectionStatusCallBack
               (IOTHUB_CLIENT_CONNECTION_STATUS status,IOTHUB_CLIENT_CONNECTION_STATUS_REASON reason
               ,void *ctx)

{
  LOGGER_LOG p_Var1;
  IOTHUB_CLIENT_CORE_LL_HANDLE_DATA *handleData;
  LOGGER_LOG l;
  void *ctx_local;
  IOTHUB_CLIENT_CONNECTION_STATUS_REASON reason_local;
  IOTHUB_CLIENT_CONNECTION_STATUS status_local;
  
  if (ctx == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_ConnectionStatusCallBack",0x26c,1,"invalid arg");
    }
  }
  else if (*(long *)((long)ctx + 0x148) != 0) {
    (**(code **)((long)ctx + 0x148))(status,reason,*(undefined8 *)((long)ctx + 0x150));
  }
  return;
}

Assistant:

static void IoTHubClientCore_LL_ConnectionStatusCallBack(IOTHUB_CLIENT_CONNECTION_STATUS status, IOTHUB_CLIENT_CONNECTION_STATUS_REASON reason, void* ctx)
{
    if (ctx == NULL)
    {
        /*"shall return"*/
        LogError("invalid arg");
    }
    else
    {
        IOTHUB_CLIENT_CORE_LL_HANDLE_DATA* handleData = (IOTHUB_CLIENT_CORE_LL_HANDLE_DATA*)ctx;

        if (handleData->conStatusCallback != NULL)
        {
            handleData->conStatusCallback(status, reason, handleData->conStatusUserContextCallback);
        }
    }

}